

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O3

void __thiscall avro::Name::~Name(Name *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->simpleName_)._M_dataplus._M_p;
  paVar2 = &(this->simpleName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->ns_)._M_dataplus._M_p;
  paVar2 = &(this->ns_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class AVRO_DECL Name {
    std::string ns_;
    std::string simpleName_;
public:
    Name() { }
    Name(const std::string& fullname);
    Name(const std::string& simpleName, const std::string& ns) : ns_(ns), simpleName_(simpleName) { check(); }

    const std::string fullname() const;
    const std::string& ns() const { return ns_; }
    const std::string& simpleName() const { return simpleName_; }

    void ns(const std::string& n) { ns_ = n; }
    void simpleName(const std::string& n) { simpleName_ = n; }
    void fullname(const std::string& n);

    bool operator < (const Name& n) const;
    void check() const;
    bool operator == (const Name& n) const;
    bool operator != (const Name& n) const { return !((*this) == n); }
    void clear() {
        ns_.clear();
        simpleName_.clear();
    }
    operator std::string() const {
        return fullname();
    }
}